

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

char * lj_debug_slotname(GCproto *pt,BCIns *ip,BCReg slot,char **name)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  GCproto *pGVar5;
  BCIns insp;
  BCReg ra;
  BCOp op;
  BCIns ins;
  char *lname;
  char **name_local;
  GCproto *pGStack_20;
  BCReg slot_local;
  BCIns *ip_local;
  GCproto *pt_local;
  
  name_local._4_4_ = slot;
  pGStack_20 = (GCproto *)ip;
LAB_0011ac47:
  pcVar4 = debug_varname(pt,(BCPos)((long)pGStack_20 - (long)(pt + 1) >> 2),name_local._4_4_);
  pGVar5 = pGStack_20;
  if (pcVar4 != (char *)0x0) {
    *name = pcVar4;
    pt_local = (GCproto *)anon_var_dwarf_1198b;
    return (char *)pt_local;
  }
LAB_0011ac90:
  do {
    while( true ) {
      pGStack_20 = pGVar5;
      pGVar5 = (GCproto *)((long)&pGStack_20[-1].varinfo.ptr64 + 4);
      if (pGVar5 <= pt + 1) {
        return (char *)0x0;
      }
      uVar1 = (uint)(pGVar5->nextgc).gcptr64;
      uVar2 = uVar1 & 0xff;
      uVar3 = uVar1 >> 8 & 0xff;
      if ((lj_bc_mode[uVar2] & 7) != 2) break;
      if ((uVar3 <= name_local._4_4_) && ((uVar2 != 0x2c || (name_local._4_4_ <= uVar1 >> 0x10)))) {
        return (char *)0x0;
      }
    }
  } while (((lj_bc_mode[uVar2] & 7) != 1) || (uVar3 != name_local._4_4_));
  switch(uVar1 & 0xff) {
  case 0x12:
    break;
  default:
    return (char *)0x0;
  case 0x2d:
    pcVar4 = lj_debug_uvname(pt,uVar1 >> 0x10);
    *name = pcVar4;
    pt_local = (GCproto *)anon_var_dwarf_119cf;
    return (char *)pt_local;
  case 0x36:
    *name = (char *)(*(long *)((pt->k).ptr64 + ((ulong)(uVar1 >> 0x10) ^ 0xffffffffffffffff) * 8) +
                    0x18);
    pt_local = (GCproto *)anon_var_dwarf_119a2;
    return (char *)pt_local;
  case 0x39:
    *name = (char *)(*(long *)((pt->k).ptr64 +
                              ((ulong)(uVar1 >> 0x10 & 0xff) ^ 0xffffffffffffffff) * 8) + 0x18);
    if ((((pt + 1 < pGVar5) && (uVar2 = (uint)pGStack_20[-1].varinfo.ptr64, (uVar2 & 0xff) == 0x12))
        && ((uVar2 >> 8 & 0xff) == uVar3 + 2)) && (uVar2 >> 0x10 == uVar1 >> 0x18)) {
      pt_local = (GCproto *)0x1bf6e5;
      return (char *)pt_local;
    }
    pt_local = (GCproto *)anon_var_dwarf_119c4;
    return (char *)pt_local;
  }
  if (uVar3 == name_local._4_4_) goto code_r0x0011ad6e;
  goto LAB_0011ac90;
code_r0x0011ad6e:
  name_local._4_4_ = uVar1 >> 0x10;
  pGStack_20 = pGVar5;
  goto LAB_0011ac47;
}

Assistant:

const char *lj_debug_slotname(GCproto *pt, const BCIns *ip, BCReg slot,
			      const char **name)
{
  const char *lname;
restart:
  lname = debug_varname(pt, proto_bcpos(pt, ip), slot);
  if (lname != NULL) { *name = lname; return "local"; }
  while (--ip > proto_bc(pt)) {
    BCIns ins = *ip;
    BCOp op = bc_op(ins);
    BCReg ra = bc_a(ins);
    if (bcmode_a(op) == BCMbase) {
      if (slot >= ra && (op != BC_KNIL || slot <= bc_d(ins)))
	return NULL;
    } else if (bcmode_a(op) == BCMdst && ra == slot) {
      switch (bc_op(ins)) {
      case BC_MOV:
	if (ra == slot) { slot = bc_d(ins); goto restart; }
	break;
      case BC_GGET:
	*name = strdata(gco2str(proto_kgc(pt, ~(ptrdiff_t)bc_d(ins))));
	return "global";
      case BC_TGETS:
	*name = strdata(gco2str(proto_kgc(pt, ~(ptrdiff_t)bc_c(ins))));
	if (ip > proto_bc(pt)) {
	  BCIns insp = ip[-1];
	  if (bc_op(insp) == BC_MOV && bc_a(insp) == ra+1+LJ_FR2 &&
	      bc_d(insp) == bc_b(ins))
	    return "method";
	}
	return "field";
      case BC_UGET:
	*name = lj_debug_uvname(pt, bc_d(ins));
	return "upvalue";
      default:
	return NULL;
      }
    }
  }
  return NULL;
}